

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_pred.c
# Opt level: O2

void com_mc_affine(com_core_t *core,pel *pred_buf)

{
  pthread_mutex_t *ppVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  com_pic_t *pcVar8;
  com_pic_t *pcVar9;
  com_seqh_t *pcVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  s32 (*paasVar21) [1024] [2];
  int iVar22;
  pel *ppVar23;
  long lVar24;
  pel *ppVar25;
  pel *ppVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  int iVar30;
  ulong uVar31;
  s32 (*paasVar32) [1024] [2];
  int iVar33;
  pel pred_snd [24576];
  uint local_6150;
  pel *local_6148;
  pel *local_6120;
  uint local_60fc;
  pel local_6060 [24624];
  
  bVar2 = core->refi[0];
  if ((char)bVar2 < '\0') {
    local_6150 = 0;
  }
  else {
    local_6150 = (uint)(-1 < core->refi[1]);
  }
  iVar3 = core->cu_width;
  iVar4 = core->cu_height;
  uVar19 = 8;
  iVar18 = 0;
  if ((core->pichdr->affine_subblock_size_idx == 1) || ((-1 < (char)bVar2 && (-1 < core->refi[1]))))
  {
    bVar11 = false;
  }
  else {
    uVar19 = 4;
    bVar11 = true;
  }
  pcVar8 = core->pic;
  iVar5 = core->cu_pix_x;
  iVar6 = core->cu_pix_y;
  lVar14 = (long)iVar3;
  local_60fc = (uint)(bVar2 >> 7);
  lVar15 = (long)g_tbl_log2[uVar19];
  uVar29 = local_60fc;
  for (; iVar18 != local_6150 + 1; iVar18 = iVar18 + 1) {
    local_6148 = pred_buf;
    if (iVar18 != 0) {
      local_6148 = local_6060;
    }
    iVar22 = iVar3;
    if ((iVar18 == 0 && local_6150 == 0) && (local_6148 = pred_buf, *(int *)core->cbfy == 0)) {
      iVar22 = pcVar8->stride_luma;
      local_6148 = pcVar8->y + (long)iVar5 + (long)(iVar22 * iVar6);
    }
    pcVar9 = core->refp[core->refi[uVar29]][uVar29].pic;
    paasVar21 = core->affine_sb_mv + uVar29;
    pcVar10 = core->seqhdr;
    iVar13 = pcVar10->bit_depth_internal;
    iVar16 = pcVar10->pic_width + 4;
    iVar12 = pcVar10->pic_height + 4;
    iVar7 = pcVar9->stride_luma;
    ppVar1 = &pcVar9->mutex;
    for (iVar17 = 0; iVar17 < iVar4; iVar17 = iVar17 + uVar19) {
      for (lVar24 = 0; lVar24 < lVar14; lVar24 = lVar24 + (ulong)uVar19) {
        uVar28 = (*paasVar21)[0][0];
        uVar27 = (*paasVar21)[0][1];
        iVar33 = (int)(((int)lVar24 + iVar5) * 0x10 + uVar28) >> 4;
        iVar20 = (int)(uVar27 + (iVar6 + iVar17) * 0x10) >> 4;
        if (iVar16 <= iVar33) {
          iVar33 = iVar16;
        }
        if (iVar33 < -0x83) {
          iVar33 = -0x84;
        }
        if (iVar12 <= iVar20) {
          iVar20 = iVar12;
        }
        if (iVar20 < -0x83) {
          iVar20 = -0x84;
        }
        iVar30 = uVar19 + 4 + iVar20;
        if (pcVar9->finished_line < iVar30) {
          pthread_mutex_lock((pthread_mutex_t *)ppVar1);
          while (pcVar9->finished_line < iVar30) {
            pthread_cond_wait((pthread_cond_t *)&pcVar9->cond,(pthread_mutex_t *)ppVar1);
          }
          pthread_mutex_unlock((pthread_mutex_t *)ppVar1);
        }
        ppVar25 = local_6148 + lVar24;
        uVar28 = uVar28 & 0xf;
        uVar27 = uVar27 & 0xf;
        ppVar23 = pcVar9->y + (long)iVar33 + (long)(iVar20 * iVar7);
        if (uVar27 == 0 && uVar28 == 0) {
          (*(code *)g_tbl_itrans[2][lVar15 + 4])();
        }
        else if (uVar27 == 0) {
          (*uavs3d_funs_handle.ipcpy[lVar15 + 4])(ppVar23,iVar7,ppVar25,iVar22,uVar19,uVar19);
        }
        else if (uVar28 == 0) {
          (*uavs3d_funs_handle.ipflt[1][lVar15 + 4])
                    (ppVar23,iVar7,ppVar25,iVar22,uVar19,uVar19,
                     g_tbl_mc_coeff_luma_hp[0] + (uVar27 << 3),~(-1 << ((byte)iVar13 & 0x1f)));
        }
        else {
          (*(*(_func_void_pel_ptr_int_pel_ptr_int_int_int_s8_ptr_int *(*) [6])
              (uavs3d_funs_handle.ipflt_ext + -1))[lVar15 + 4])
                    (ppVar23,iVar7,ppVar25,iVar22,uVar19,uVar19,g_tbl_mc_coeff_luma_hp[uVar28],
                     uVar27 * 8 + 0x159d70);
        }
        paasVar21 = (s32 (*) [1024] [2])(*paasVar21 + 1);
      }
      local_6148 = local_6148 + (int)(uVar19 * iVar22);
    }
    uVar29 = (uint)(uVar29 == 0);
  }
  if ((char)local_6150 != '\0') {
    ppVar25 = pred_buf;
    iVar18 = iVar3;
    if (*(int *)core->cbfy == 0) {
      iVar18 = pcVar8->stride_luma;
      ppVar25 = pcVar8->y + (long)iVar5 + (long)(iVar18 * iVar6);
    }
    (*uavs3d_funs_handle.avg_pel[(long)core->cu_log2w + -2])
              (ppVar25,iVar18,pred_buf,local_6060,iVar3,iVar4);
  }
  ppVar25 = pred_buf + iVar4 * iVar3;
  for (iVar18 = 0; iVar18 != local_6150 + 1; iVar18 = iVar18 + 1) {
    local_6120 = ppVar25;
    if (iVar18 != 0) {
      local_6120 = local_6060;
    }
    iVar22 = iVar3;
    if ((iVar18 == 0 && local_6150 == 0) && (local_6120 = ppVar25, *(short *)core->cbfc == 0)) {
      iVar22 = pcVar8->stride_chroma;
      local_6120 = pcVar8->uv + (long)iVar5 + (long)(iVar22 * (iVar6 / 2));
    }
    uVar31 = (ulong)local_60fc;
    pcVar9 = core->refp[core->refi[uVar31]][uVar31].pic;
    paasVar21 = core->affine_sb_mv + uVar31;
    pcVar10 = core->seqhdr;
    uVar19 = ~(-1 << ((byte)pcVar10->bit_depth_internal & 0x1f));
    iVar12 = pcVar10->pic_width + 4 >> 1;
    iVar13 = pcVar10->pic_height + 4 >> 1;
    iVar7 = pcVar9->stride_chroma;
    ppVar1 = &pcVar9->mutex;
    if (bVar11) {
      paasVar32 = paasVar21;
      for (iVar16 = 0; iVar16 < iVar4; iVar16 = iVar16 + 8) {
        paasVar32 = (s32 (*) [1024] [2])(*paasVar32 + (iVar3 >> 2));
        for (lVar15 = 0; lVar15 < lVar14; lVar15 = lVar15 + 8) {
          uVar29 = ((*paasVar32)[1][1] +
                    (*paasVar21)[0][1] + (*paasVar21)[1][1] + (*paasVar32)[0][1] + 2 >> 2) +
                   (iVar6 + iVar16) * 0x10;
          uVar28 = ((int)lVar15 + iVar5) * 0x10 +
                   ((*paasVar21)[0][0] + (*paasVar21)[1][0] + (*paasVar32)[0][0] +
                    (*paasVar32)[1][0] + 2 >> 2);
          iVar17 = (int)uVar28 >> 5;
          iVar33 = (int)uVar29 >> 5;
          if (iVar12 <= iVar17) {
            iVar17 = iVar12;
          }
          iVar20 = iVar17 * 2;
          if (iVar17 < -0x42) {
            iVar20 = -0x84;
          }
          if (iVar13 <= iVar33) {
            iVar33 = iVar13;
          }
          if (iVar33 < -0x41) {
            iVar33 = -0x42;
          }
          iVar17 = iVar33 * 2 + 0xc;
          if (pcVar9->finished_line < iVar17) {
            pthread_mutex_lock((pthread_mutex_t *)ppVar1);
            while (pcVar9->finished_line < iVar17) {
              pthread_cond_wait((pthread_cond_t *)&pcVar9->cond,(pthread_mutex_t *)ppVar1);
            }
            pthread_mutex_unlock((pthread_mutex_t *)ppVar1);
          }
          ppVar23 = local_6120 + lVar15;
          uVar28 = uVar28 & 0x1f;
          uVar29 = uVar29 & 0x1f;
          ppVar26 = pcVar9->uv + (long)iVar20 + (long)(iVar33 * iVar7);
          if (uVar29 == 0 && uVar28 == 0) {
            (*uavs3d_funs_handle.ipcpy[1])(ppVar26,iVar7,ppVar23,iVar22,8,4);
          }
          else if (uVar29 == 0) {
            (*uavs3d_funs_handle.ipflt[1][1])
                      (ppVar26,iVar7,ppVar23,iVar22,8,4,g_tbl_mc_coeff_chroma_hp[0] + (uVar28 << 2),
                       uVar19);
          }
          else if (uVar28 == 0) {
            (*uavs3d_funs_handle.ipflt[3][1])
                      (ppVar26,iVar7,ppVar23,iVar22,8,4,g_tbl_mc_coeff_chroma_hp[0] + (uVar29 << 2),
                       uVar19);
          }
          else {
            (*uavs3d_funs_handle.ipflt_ext[1][1])
                      (ppVar26,iVar7,ppVar23,iVar22,8,4,g_tbl_mc_coeff_chroma_hp[uVar28],
                       g_tbl_mc_coeff_chroma_hp[uVar29],uVar19);
          }
          paasVar21 = (s32 (*) [1024] [2])(*paasVar21 + 2);
          paasVar32 = (s32 (*) [1024] [2])(*paasVar32 + 2);
        }
        local_6120 = local_6120 + iVar22 * 4;
        paasVar21 = (s32 (*) [1024] [2])(*paasVar21 + (iVar3 >> 2));
      }
    }
    else {
      for (iVar16 = 0; iVar16 < iVar4; iVar16 = iVar16 + 8) {
        for (lVar15 = 0; lVar15 < lVar14; lVar15 = lVar15 + 8) {
          uVar28 = ((int)lVar15 + iVar5) * 0x10 + (*paasVar21)[0][0];
          uVar29 = (*paasVar21)[0][1] + (iVar6 + iVar16) * 0x10;
          iVar17 = (int)uVar28 >> 5;
          iVar33 = (int)uVar29 >> 5;
          if (iVar12 <= iVar17) {
            iVar17 = iVar12;
          }
          iVar20 = iVar17 * 2;
          if (iVar17 < -0x42) {
            iVar20 = -0x84;
          }
          if (iVar13 <= iVar33) {
            iVar33 = iVar13;
          }
          if (iVar33 < -0x41) {
            iVar33 = -0x42;
          }
          iVar17 = iVar33 * 2 + 0xc;
          if (pcVar9->finished_line < iVar17) {
            pthread_mutex_lock((pthread_mutex_t *)ppVar1);
            while (pcVar9->finished_line < iVar17) {
              pthread_cond_wait((pthread_cond_t *)&pcVar9->cond,(pthread_mutex_t *)ppVar1);
            }
            pthread_mutex_unlock((pthread_mutex_t *)ppVar1);
          }
          ppVar23 = local_6120 + lVar15;
          uVar28 = uVar28 & 0x1f;
          uVar29 = uVar29 & 0x1f;
          ppVar26 = pcVar9->uv + (long)iVar20 + (long)(iVar33 * iVar7);
          if (uVar29 == 0 && uVar28 == 0) {
            (*uavs3d_funs_handle.ipcpy[1])(ppVar26,iVar7,ppVar23,iVar22,8,4);
          }
          else if (uVar29 == 0) {
            (*uavs3d_funs_handle.ipflt[1][1])
                      (ppVar26,iVar7,ppVar23,iVar22,8,4,g_tbl_mc_coeff_chroma_hp[0] + (uVar28 << 2),
                       uVar19);
          }
          else if (uVar28 == 0) {
            (*uavs3d_funs_handle.ipflt[3][1])
                      (ppVar26,iVar7,ppVar23,iVar22,8,4,g_tbl_mc_coeff_chroma_hp[0] + (uVar29 << 2),
                       uVar19);
          }
          else {
            (*uavs3d_funs_handle.ipflt_ext[1][1])
                      (ppVar26,iVar7,ppVar23,iVar22,8,4,g_tbl_mc_coeff_chroma_hp[uVar28],
                       g_tbl_mc_coeff_chroma_hp[uVar29],uVar19);
          }
          paasVar21 = (s32 (*) [1024] [2])(*paasVar21 + 1);
        }
        local_6120 = local_6120 + iVar22 * 4;
      }
    }
    local_60fc = (uint)(local_60fc == 0);
  }
  if ((char)local_6150 != '\0') {
    ppVar23 = ppVar25;
    iVar18 = iVar3;
    if (*(short *)core->cbfc == 0) {
      iVar18 = pcVar8->stride_chroma;
      ppVar23 = pcVar8->uv + (long)iVar5 + (long)((iVar6 / 2) * iVar18);
    }
    (*uavs3d_funs_handle.avg_pel[(long)core->cu_log2w + -2])
              (ppVar23,iVar18,ppVar25,local_6060,iVar3,iVar4 >> 1);
  }
  return;
}

Assistant:

void com_mc_affine(com_core_t *core, pel *pred_buf)
{
    com_pic_t *pic = core->pic;
    int x = core->cu_pix_x;
    int y = core->cu_pix_y;
    int cu_width = core->cu_width;
    int cu_height = core->cu_height;
    com_ref_pic_t(*refp)[REFP_NUM] = core->refp;
    s8 *refi = core->refi;
    com_pic_t *ref_pic;
    ALIGNED_32(pel pred_snd[MAX_CU_DIM + MAX_CU_DIM / 2]);
    int sub_blk_size;
    int bi = REFI_IS_VALID(refi[REFP_0]) && REFI_IS_VALID(refi[REFP_1]);
    int lidx, lidx_base = REFI_IS_VALID(refi[REFP_0]) ? REFP_0 : REFP_1;
    pel *dstl, *dstc;
    int i_dstl, i_dstc;
    int blk_dim = cu_width * cu_height;

    if (core->pichdr->affine_subblock_size_idx == 1 || (REFI_IS_VALID(refi[REFP_0]) && REFI_IS_VALID(refi[REFP_1]))) {
        sub_blk_size = 8;
    } else {
        sub_blk_size = 4;
    }

    lidx = lidx_base;

    for (int i = 0; i <= bi; i++) {
        ref_pic = refp[refi[lidx]][lidx].pic;

        if (i) {
            i_dstl = cu_width;
            dstl = pred_snd;
        } else if (!bi && !M32(core->cbfy)) {
            i_dstl = pic->stride_luma;
            dstl = pic->y + y * i_dstl + x;
        } else {
            i_dstl = cu_width;
            dstl = pred_buf;
        }
        com_affine_mc_luma(core, dstl, i_dstl, x, y, cu_width, cu_height, ref_pic, sub_blk_size, lidx);
        lidx = !lidx;
    }
    if (bi) {
        if (!M32(core->cbfy)) {
            i_dstl = pic->stride_luma;
            dstl = pic->y + y * i_dstl + x;
        } else {
            i_dstl = cu_width;
            dstl = pred_buf;
        }
        uavs3d_funs_handle.avg_pel[core->cu_log2w - 2](dstl, i_dstl, pred_buf, pred_snd, cu_width, cu_height);
    }

    lidx = lidx_base;

    for (int i = 0; i <= bi; i++) {
        ref_pic = refp[refi[lidx]][lidx].pic;

        if (i) {
            i_dstc = cu_width;
            dstc = pred_snd;
        } else if (!bi && !M16(core->cbfc)) {
            i_dstc = pic->stride_chroma;
            dstc = pic->uv + y / 2 * i_dstc + x;
        } else {
            i_dstc = cu_width;
            dstc = pred_buf + blk_dim;
        }
        com_affine_mc_chroma(core, dstc, i_dstc, x, y, cu_width, cu_height, ref_pic, sub_blk_size, lidx);
        lidx = !lidx;
    }
    if (bi) {
        if (!M16(core->cbfc)) {
            i_dstc = pic->stride_chroma;
            dstc = pic->uv + y / 2 * i_dstc + x;
        } else {
            i_dstc = cu_width;
            dstc = pred_buf + blk_dim;
        }
        uavs3d_funs_handle.avg_pel[core->cu_log2w - 2](dstc, i_dstc, pred_buf + blk_dim, pred_snd, cu_width, cu_height >> 1);
    }
}